

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

_Bool art_iterator_erase(art_iterator_t *iterator,art_val_t *erased_val)

{
  _Bool _Var1;
  art_ref_t aVar2;
  art_t *art;
  art_ref_t ref;
  art_val_t *in_RSI;
  art_iterator_t *in_RDI;
  art_key_chunk_t key_chunk_in_grandparent;
  art_inner_node_t *grandparent_node;
  art_ref_t grandparent_ref;
  art_ref_t new_parent_ref;
  art_key_chunk_t key_chunk_in_parent;
  art_inner_node_t *parent_node;
  art_ref_t parent_ref;
  _Bool went_up;
  art_key_chunk_t initial_key [6];
  art_val_t erased_val_local;
  art_iterator_t *in_stack_ffffffffffffff78;
  art_iterator_t *in_stack_ffffffffffffff80;
  art_t *iterator_00;
  art_node_t *in_stack_ffffffffffffff88;
  undefined2 uVar3;
  art_t *art_00;
  art_key_chunk_t *in_stack_ffffffffffffffa8;
  art_iterator_t *in_stack_ffffffffffffffb0;
  art_val_t local_20;
  art_val_t *local_18;
  art_iterator_t *local_10;
  _Bool local_1;
  
  local_18 = in_RSI;
  if (in_RSI == (art_val_t *)0x0) {
    local_18 = &local_20;
  }
  if (in_RDI->value == (art_val_t *)0x0) {
    local_1 = false;
  }
  else {
    local_10 = in_RDI;
    *local_18 = *in_RDI->value;
    art_00 = local_10->art;
    art_iterator_node(in_stack_ffffffffffffff80);
    aVar2 = art_iterator_ref(local_10);
    art_ref_typecode(aVar2);
    art_node_free(art_00,in_stack_ffffffffffffff88,
                  (art_typecode_t)((ulong)in_stack_ffffffffffffff80 >> 0x38));
    _Var1 = art_iterator_up(in_stack_ffffffffffffff78);
    if (_Var1) {
      aVar2 = art_iterator_ref(local_10);
      art = (art_t *)art_iterator_node(in_stack_ffffffffffffff80);
      iterator_00 = local_10->art;
      art_ref_typecode(aVar2);
      ref = art_node_erase(art,(art_inner_node_t *)iterator_00,
                           (art_typecode_t)((ulong)in_stack_ffffffffffffff78 >> 0x38),
                           (art_key_chunk_t)((ulong)in_stack_ffffffffffffff78 >> 0x30));
      uVar3 = (undefined2)((ulong)art >> 0x30);
      if (ref != aVar2) {
        local_10->frames[local_10->frame].ref = ref;
        _Var1 = art_iterator_up(in_stack_ffffffffffffff78);
        if (_Var1) {
          in_stack_ffffffffffffffb0 = (art_iterator_t *)art_iterator_ref(local_10);
          in_stack_ffffffffffffffa8 =
               (art_key_chunk_t *)art_iterator_node((art_iterator_t *)iterator_00);
          art_ref_typecode((art_ref_t)in_stack_ffffffffffffffb0);
          art_replace((art_inner_node_t *)art_00,(art_typecode_t)((ushort)uVar3 >> 8),
                      (art_key_chunk_t)uVar3,(art_ref_t)iterator_00);
        }
        else {
          local_10->art->root = ref;
        }
      }
      local_10->frame = '\0';
      local_10->depth = '\0';
      art_node_iterator_lower_bound(ref,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_1 = true;
    }
    else {
      local_10->art->root = 0;
      art_iterator_invalid_loc((art_iterator_t *)0x11c4c6);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool art_iterator_erase(art_iterator_t *iterator, art_val_t *erased_val) {
    art_val_t erased_val_local;
    if (erased_val == NULL) {
        erased_val = &erased_val_local;
    }
    if (iterator->value == NULL) {
        return false;
    }
    art_key_chunk_t initial_key[ART_KEY_BYTES];
    memcpy(initial_key, iterator->key, ART_KEY_BYTES);

    *erased_val = *iterator->value;
    // Erase the leaf.
    art_node_free(iterator->art, art_iterator_node(iterator),
                  art_ref_typecode(art_iterator_ref(iterator)));
    bool went_up = art_iterator_up(iterator);
    if (!went_up) {
        // We're erasing the root.
        iterator->art->root = CROARING_ART_NULL_REF;
        art_iterator_invalid_loc(iterator);
        return true;
    }

    // Erase the leaf in its parent.
    art_ref_t parent_ref = art_iterator_ref(iterator);
    art_inner_node_t *parent_node =
        (art_inner_node_t *)art_iterator_node(iterator);
    art_key_chunk_t key_chunk_in_parent =
        iterator->key[iterator->depth + parent_node->prefix_size];
    art_ref_t new_parent_ref =
        art_node_erase(iterator->art, parent_node, art_ref_typecode(parent_ref),
                       key_chunk_in_parent);

    if (new_parent_ref != parent_ref) {
        // Replace the pointer to the inner node we erased from in its
        // parent (it may be a leaf now).
        iterator->frames[iterator->frame].ref = new_parent_ref;
        went_up = art_iterator_up(iterator);
        if (went_up) {
            art_ref_t grandparent_ref = art_iterator_ref(iterator);
            art_inner_node_t *grandparent_node =
                (art_inner_node_t *)art_iterator_node(iterator);
            art_key_chunk_t key_chunk_in_grandparent =
                iterator->key[iterator->depth + grandparent_node->prefix_size];
            art_replace(grandparent_node, art_ref_typecode(grandparent_ref),
                        key_chunk_in_grandparent, new_parent_ref);
        } else {
            // We were already at the rootmost node.
            iterator->art->root = new_parent_ref;
        }
    }

    iterator->frame = 0;
    iterator->depth = 0;
    // Do a lower bound search for the initial key, which will find the
    // first greater key if it exists. This can likely be mildly faster if
    // we instead start from the current position.
    art_node_iterator_lower_bound(iterator->art->root, iterator, initial_key);
    return true;
}